

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O3

void __thiscall pstore::database::sync(database *this)

{
  undefined8 *puVar1;
  address aVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  typed_address<pstore::trailer> new_footer_pos;
  uint in_ESI;
  long lVar5;
  _Alloc_hider local_50;
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> local_48;
  
  aVar2.a_ = (this->size_).footer_pos_.a_.a_;
  if (in_ESI == 0xffffffff) {
LAB_0019e62c:
    getro<pstore::header,void>
              ((database *)&stack0xffffffffffffffb0,(typed_address<pstore::header>)this,0);
    new_footer_pos.a_.a_ = (address)((address *)(local_50._M_p + 0x28))->a_;
    if ((_Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
         )local_48._M_head_impl != (array<pstore::sat_entry,_65536UL> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_head_impl);
    }
    if (in_ESI == 0xffffffff && new_footer_pos.a_.a_ == (address)aVar2.a_) {
      return;
    }
    iVar4 = (*((this->storage_).file_.
               super___shared_ptr<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_file_base[9])();
    if (CONCAT44(extraout_var,iVar4) < (long)new_footer_pos.a_.a_ + 0x70U) {
      (*((this->storage_).file_.
         super___shared_ptr<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_file_base[5])
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffffb0);
      raise<pstore::error_code,std::__cxx11::string>
                (footer_corrupt,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffffb0);
    }
    storage::map_bytes(&this->storage_,(this->size_).logical_,(long)new_footer_pos.a_.a_ + 0x70U);
    sizes::update_footer_pos(&this->size_,new_footer_pos);
    trailer::validate(this,new_footer_pos);
    if (in_ESI == 0xffffffff) goto LAB_0019e6c4;
  }
  else {
    uVar3 = get_current_revision(this);
    if (uVar3 == in_ESI) {
      return;
    }
    if (uVar3 < in_ESI) goto LAB_0019e62c;
    if (aVar2.a_ == 0) {
      assert_failed("is_newer || footer_pos != typed_address<trailer>::null ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/database.cpp"
                    ,0xaf);
    }
  }
  new_footer_pos = older_revision_footer_pos(this,in_ESI);
LAB_0019e6c4:
  lVar5 = 0;
  do {
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)&(this->indices_)._M_elems[0].
                       super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + lVar5);
    puVar1 = (undefined8 *)
             ((long)&(this->indices_)._M_elems[0].
                     super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr + lVar5);
    *puVar1 = 0;
    puVar1[1] = 0;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x60);
  sizes::update_footer_pos(&this->size_,new_footer_pos);
  return;
}

Assistant:

void database::sync (unsigned const revision) {
        // If revision <= current revision then we don't need to start at head! We do so if the
        // revision is later than the current region (that's what is_newer is about with footer_pos
        // tracking the current footer as it moves backwards).
        bool is_newer = false;
        typed_address<trailer> footer_pos = size_.footer_pos ();

        if (revision == head_revision) {
            // If we're asked for the head, then we always need a full check to see if there's
            // a newer revision.
            is_newer = true;
        } else {
            unsigned const current_revision = this->get_current_revision ();
            // An early out if the user requests the same revision that we already have.
            if (revision == current_revision) {
                return;
            }
            if (revision > current_revision) {
                is_newer = true;
            }
        }

        // The transactions form a singly linked list with the newest revision at its head.
        // If we're asked for a revision _newer_ that the currently synced number then we need
        // to hunt backwards starting at the head. Syncing to an older revision is simpler because
        // we can work back from the current revision.
        PSTORE_ASSERT (is_newer || footer_pos != typed_address<trailer>::null ());
        if (is_newer) {
            // This atomic read of footer_pos fixes our view of the head-revision. Any transactions
            // after this point won't be seen by this process.
            auto const new_footer_pos =
                this->getro (typed_address<header>::null ())->footer_pos.load ();

            if (revision == head_revision && new_footer_pos == footer_pos) {
                // We were asked for the head revision but the head turns out to the same
                // as the one to which we're currently synced. The previous early out code didn't
                // have sufficient context to catch this case, but here we do. Nothing more to do.
                return;
            }

            footer_pos = new_footer_pos;

            // Always check file size after loading from the footer.
            auto const file_size = storage_.file ()->size ();

            // Perform a proper footer validity check.
            if (footer_pos.absolute () + sizeof (trailer) > file_size) {
                raise (error_code::footer_corrupt, storage_.file ()->path ());
            }

            // We may need to map additional data from the file. If another process has added
            // data to the store since we opened our connection, then a sync may want to access
            // that new data. Deal with that possibility here.
            storage_.map_bytes (size_.logical_size (), footer_pos.absolute () + sizeof (trailer));

            size_.update_footer_pos (footer_pos);
            trailer::validate (*this, footer_pos);
        }

        // The code above moves to the head revision. If that's what was requested, then we're done.
        // If a specific numbered revision is needed, then we need to search for it.
        if (revision != head_revision) {
            footer_pos = this->older_revision_footer_pos (revision);
        }

        // We must clear the index cache because the current revision has changed.
        this->clear_index_cache ();
        size_.update_footer_pos (footer_pos);
    }